

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildTestDyndepBuildDiscoverNewInputWithValidation::
~BuildTestDyndepBuildDiscoverNewInputWithValidation
          (BuildTestDyndepBuildDiscoverNewInputWithValidation *this)

{
  BuildTest::~BuildTest(&this->super_BuildTest);
  operator_delete(this,0x460);
  return;
}

Assistant:

TEST_F(BuildTest, DyndepBuildDiscoverNewInputWithValidation) {
  // Verify that a dyndep file cannot contain the |@ validation
  // syntax.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out: dyndep |@ validation\n"
);

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);

  EXPECT_FALSE(builder_.Build(&err));

  string err_first_line = err.substr(0, err.find("\n"));
  EXPECT_EQ("dd:2: expected newline, got '|@'", err_first_line);
}